

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateSetStateChangeCallback
               (HelicsFederate fed,
               _func_void_HelicsFederateState_HelicsFederateState_void_ptr *stateChange,
               void *userdata,HelicsError *err)

{
  Federate *this;
  _Any_data *this_00;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = &local_68;
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (stateChange == (_func_void_HelicsFederateState_HelicsFederateState_void_ptr *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      helics::Federate::setModeUpdateCallback
                (this,(function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)&local_68
                );
    }
    else {
      local_28 = std::
                 _Function_handler<void_(helics::Federate::Modes,_helics::Federate::Modes),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1282:43)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<void_(helics::Federate::Modes,_helics::Federate::Modes),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1282:43)>
                 ::_M_manager;
      local_40._M_unused._0_8_ = (undefined8)stateChange;
      local_40._8_8_ = userdata;
      helics::Federate::setModeUpdateCallback
                (this,(function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)&local_40
                );
      this_00 = &local_40;
    }
    std::_Function_base::~_Function_base((_Function_base *)this_00);
  }
  return;
}

Assistant:

void helicsFederateSetStateChangeCallback(HelicsFederate fed,
                                          void (*stateChange)(HelicsFederateState newState, HelicsFederateState oldState, void* userdata),
                                          void* userdata,
                                          HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (stateChange == nullptr) {
            fedptr->setModeUpdateCallback({});
        } else {
            fedptr->setModeUpdateCallback([stateChange, userdata](helics::Federate::Modes newMode, helics::Federate::Modes oldMode) {
                stateChange(stateConversion(newMode), stateConversion(oldMode), userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}